

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::verifyResult
          (TestStatus *__return_storage_ptr__,StoreTestInstance *this)

{
  Texture *this_00;
  VkFormat VVar1;
  long lVar2;
  TestLog *log;
  bool bVar3;
  DeviceInterface *vkd;
  VkDevice device;
  IVec3 imageSize;
  ConstPixelBufferAccess result;
  TextureLevel reference;
  TextureFormat local_100;
  long local_f8;
  long local_f0 [2];
  IVec3 local_dc;
  ConstPixelBufferAccess local_d0;
  TextureLevel local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  vkd = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  this_00 = &(this->super_BaseTestInstance).m_texture;
  Texture::size(this_00);
  VVar1 = (this->super_BaseTestInstance).m_format;
  generateReferenceImage(&local_a8,&local_dc,VVar1,VVar1);
  lVar2 = (long)(((this->m_imageBuffer).
                  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                  m_data.ptr)->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
             this->m_imageSizeBytes);
  local_100 = ::vk::mapVkFormat((this->super_BaseTestInstance).m_format);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_d0,&local_100,&local_dc,*(void **)(lVar2 + 0x18));
  log = ((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  VVar1 = (this->super_BaseTestInstance).m_format;
  tcu::TextureLevel::getAccess(&local_80,&local_a8);
  local_58.m_format = local_d0.m_format;
  local_58.m_size.m_data[0] = local_d0.m_size.m_data[0];
  local_58.m_size.m_data[1] = local_d0.m_size.m_data[1];
  local_58.m_size.m_data[2] = local_d0.m_size.m_data[2];
  local_58.m_pitch.m_data[0] = local_d0.m_pitch.m_data[0];
  local_58.m_pitch.m_data[1] = local_d0.m_pitch.m_data[1];
  local_58.m_pitch.m_data[2] = local_d0.m_pitch.m_data[2];
  local_58.m_data = local_d0.m_data;
  bVar3 = comparePixelBuffers(log,this_00,VVar1,&local_80,&local_58);
  local_100 = (TextureFormat)local_f0;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_100,local_f8 + (long)local_100
              );
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Image comparison failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_100,local_f8 + (long)local_100
              );
  }
  if (local_100 != (TextureFormat)local_f0) {
    operator_delete((void *)local_100,local_f0[0] + 1);
  }
  tcu::TextureLevel::~TextureLevel(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StoreTestInstance::verifyResult	(void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const tcu::IVec3 imageSize = m_texture.size();
	const tcu::TextureLevel reference = generateReferenceImage(imageSize, m_format);

	const Allocation& alloc = m_imageBuffer->getAllocation();
	invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_imageSizeBytes);
	const tcu::ConstPixelBufferAccess result(mapVkFormat(m_format), imageSize, alloc.getHostPtr());

	if (comparePixelBuffers(m_context.getTestContext().getLog(), m_texture, m_format, reference.getAccess(), result))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}